

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O3

size_t PHF::uniq<phf_string>(phf_string *k,size_t n)

{
  int iVar1;
  long lVar2;
  phf_string *ppVar3;
  size_t sVar4;
  long lVar5;
  
  qsort(k,n,0x10,Uniq::cmp<phf_string>);
  sVar4 = 1;
  if (1 < n) {
    lVar2 = n - 1;
    ppVar3 = k + 1;
    lVar5 = 0;
    do {
      if (ppVar3->n == k[lVar5].n) {
        iVar1 = bcmp(ppVar3->p,k[lVar5].p,ppVar3->n);
        if (iVar1 != 0) goto LAB_001200c6;
      }
      else {
LAB_001200c6:
        lVar5 = lVar5 + 1;
        sVar4 = ppVar3->n;
        k[lVar5].p = ppVar3->p;
        k[lVar5].n = sVar4;
      }
      ppVar3 = ppVar3 + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
    sVar4 = lVar5 + 1;
  }
  if (n == 0) {
    sVar4 = 0;
  }
  return sVar4;
}

Assistant:

PHF_PUBLIC size_t PHF::uniq(key_t k[], const size_t n) {
	using namespace PHF::Uniq;
	size_t i, j;

	qsort(k, n, sizeof *k, reinterpret_cast<int(*)(const void *, const void *)>(&cmp<key_t>));

	for (i = 1, j = 0; i < n; i++) {
		if (k[i] != k[j])
			k[++j] = k[i];
	}

	return (n > 0)? j + 1 : 0;
}